

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::Tarjan(cmComputeComponentGraph *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar1;
  size_type __new_size;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  value_type_conflict2 local_3c;
  TarjanEntry entry;
  
  uVar1 = ((long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>)
                 .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  entry.Root = 0;
  entry.VisitIndex = 0;
  uVar3 = 0;
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,0);
  iVar4 = (int)uVar1;
  __new_size = (size_type)iVar4;
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,__new_size,&entry);
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,0);
  local_3c = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,__new_size,&local_3c);
  this->TarjanWalkId = 0;
  this_00 = &this->TarjanVisited;
  std::vector<int,_std::allocator<int>_>::resize(this_00,0);
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,&local_3c);
  uVar2 = 0;
  if (0 < iVar4) {
    uVar2 = uVar1 & 0xffffffff;
  }
  do {
    if (uVar2 == uVar3) {
      return;
    }
    if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar3] == 0) {
      if ((this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur !=
          (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        __assert_fail("this->TarjanStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeComponentGraph.cxx"
                      ,0x28,"void cmComputeComponentGraph::Tarjan()");
      }
      this->TarjanWalkId = this->TarjanWalkId + 1;
      this->TarjanIndex = 0;
      TarjanVisit(this,(int)uVar3);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::Tarjan()
{
  int n = static_cast<int>(this->InputGraph.size());
  TarjanEntry entry = { 0, 0 };
  this->TarjanEntries.resize(0);
  this->TarjanEntries.resize(n, entry);
  this->TarjanComponents.resize(0);
  this->TarjanComponents.resize(n, -1);
  this->TarjanWalkId = 0;
  this->TarjanVisited.resize(0);
  this->TarjanVisited.resize(n, 0);
  for (int i = 0; i < n; ++i) {
    // Start a new DFS from this node if it has never been visited.
    if (!this->TarjanVisited[i]) {
      assert(this->TarjanStack.empty());
      ++this->TarjanWalkId;
      this->TarjanIndex = 0;
      this->TarjanVisit(i);
    }
  }
}